

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lex.c
# Opt level: O2

int lj_lex_setup(lua_State *L,LexState *ls)

{
  char **ppcVar1;
  char *pcVar2;
  byte *pbVar3;
  char *pcVar4;
  TValue *pTVar5;
  bool bVar6;
  uint uVar7;
  GCstr *pGVar8;
  uint uVar9;
  bool bVar10;
  
  ls->L = L;
  ls->fs = (FuncState *)0x0;
  ppcVar1 = &ls->p;
  ls->tok = 0;
  ls->lookahead = 0x121;
  ls->p = (char *)0x0;
  ls->pe = (char *)0x0;
  ls->vstack = (VarInfo *)0x0;
  ls->sizevstack = 0;
  ls->vtop = 0;
  *(undefined8 *)&ls->vtop = 0;
  *(undefined8 *)((long)&ls->bcstack + 4) = 0;
  ls->linenumber = 1;
  ls->lastline = 1;
  ls->endmark = 0;
  uVar7 = lex_more(ls);
  ls->c = uVar7;
  bVar10 = uVar7 == 0xef;
  if (bVar10) {
    pcVar4 = ls->p;
    pcVar2 = pcVar4 + 2;
    uVar7 = 0xef;
    bVar6 = true;
    if (((pcVar2 <= ls->pe) && (*pcVar4 == -0x45)) && (pcVar4[1] == -0x41)) {
      *ppcVar1 = pcVar2;
      if (pcVar2 < ls->pe) {
        *ppcVar1 = pcVar4 + 3;
        uVar7 = (uint)(byte)pcVar4[2];
      }
      else {
        uVar7 = lex_more(ls);
      }
      ls->c = uVar7;
      goto LAB_001454d4;
    }
  }
  else {
LAB_001454d4:
    bVar6 = !bVar10;
    if (uVar7 == 0x23) {
      do {
        pbVar3 = (byte *)ls->p;
        if (pbVar3 < ls->pe) {
          *ppcVar1 = (char *)(pbVar3 + 1);
          uVar7 = (uint)*pbVar3;
        }
        else {
          uVar7 = lex_more(ls);
        }
        ls->c = uVar7;
        if (uVar7 == 0xffffffff) {
          return 0;
        }
      } while ((uVar7 != 10) && (uVar7 != 0xd));
      lex_newline(ls);
      uVar9 = 0;
      uVar7 = ls->c;
      goto joined_r0x00145523;
    }
  }
  uVar9 = (uint)(uVar7 == 0x1b);
  if (bVar6) {
    return uVar9;
  }
joined_r0x00145523:
  if (uVar7 != 0x1b) {
    return uVar9;
  }
  pTVar5 = L->top;
  L->top = pTVar5 + 1;
  pGVar8 = lj_err_str(L,LJ_ERR_BCBAD);
  pTVar5->u64 = (ulong)pGVar8 | 0xfffd800000000000;
  lj_err_throw(L,3);
}

Assistant:

int lj_lex_setup(lua_State *L, LexState *ls)
{
  int header = 0;
  ls->L = L;
  ls->fs = NULL;
  ls->pe = ls->p = NULL;
  ls->vstack = NULL;
  ls->sizevstack = 0;
  ls->vtop = 0;
  ls->bcstack = NULL;
  ls->sizebcstack = 0;
  ls->tok = 0;
  ls->lookahead = TK_eof;  /* No look-ahead token. */
  ls->linenumber = 1;
  ls->lastline = 1;
  ls->endmark = 0;
  lex_next(ls);  /* Read-ahead first char. */
  if (ls->c == 0xef && ls->p + 2 <= ls->pe && (uint8_t)ls->p[0] == 0xbb &&
      (uint8_t)ls->p[1] == 0xbf) {  /* Skip UTF-8 BOM (if buffered). */
    ls->p += 2;
    lex_next(ls);
    header = 1;
  }
  if (ls->c == '#') {  /* Skip POSIX #! header line. */
    do {
      lex_next(ls);
      if (ls->c == LEX_EOF) return 0;
    } while (!lex_iseol(ls));
    lex_newline(ls);
    header = 1;
  }
  if (ls->c == LUA_SIGNATURE[0]) {  /* Bytecode dump. */
    if (header) {
      /*
      ** Loading bytecode with an extra header is disabled for security
      ** reasons. This may circumvent the usual check for bytecode vs.
      ** Lua code by looking at the first char. Since this is a potential
      ** security violation no attempt is made to echo the chunkname either.
      */
      setstrV(L, L->top++, lj_err_str(L, LJ_ERR_BCBAD));
      lj_err_throw(L, LUA_ERRSYNTAX);
    }
    return 1;
  }
  return 0;
}